

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldShard
               (char *total_shards_env,char *shard_index_env,bool in_subprocess_for_death_test)

{
  char *pcVar1;
  Message *this;
  Message *msg_00;
  Message *this_00;
  Message *this_01;
  byte in_DL;
  Message msg_2;
  Message msg_1;
  Message msg;
  Int32 shard_index;
  Int32 total_shards;
  char (*in_stack_fffffffffffffe48) [48];
  Message *in_stack_fffffffffffffe50;
  Message *in_stack_fffffffffffffe58;
  Message *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe90;
  Int32 default_val;
  Message *in_stack_fffffffffffffe98;
  Message *in_stack_fffffffffffffea0;
  string local_c8 [48];
  string local_98 [48];
  string local_68 [68];
  Int32 local_24;
  int local_20;
  byte local_19;
  bool local_1;
  
  default_val = (Int32)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  local_19 = in_DL & 1;
  if (local_19 == 0) {
    local_20 = Int32FromEnvOrDie((char *)in_stack_fffffffffffffe98,default_val);
    local_24 = Int32FromEnvOrDie((char *)in_stack_fffffffffffffe98,default_val);
    if ((local_20 == -1) && (local_24 == -1)) {
      local_1 = false;
    }
    else {
      if ((local_20 == -1) && (local_24 != -1)) {
        Message::Message(in_stack_fffffffffffffe80);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [41])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [18])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [4])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [17])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [19])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [9])in_stack_fffffffffffffe48);
        Message::Message(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        Message::~Message((Message *)0x181574);
        Message::GetString_abi_cxx11_(in_stack_fffffffffffffe58);
        pcVar1 = (char *)std::__cxx11::string::c_str();
        ColoredPrintf(COLOR_RED,pcVar1);
        std::__cxx11::string::~string(local_68);
        fflush(_stdout);
        exit(1);
      }
      if ((local_20 != -1) && (local_24 == -1)) {
        Message::Message(in_stack_fffffffffffffe80);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [41])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [19])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [4])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [17])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [18])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [9])in_stack_fffffffffffffe48);
        Message::Message(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        Message::~Message((Message *)0x18175c);
        Message::GetString_abi_cxx11_(in_stack_fffffffffffffe58);
        pcVar1 = (char *)std::__cxx11::string::c_str();
        ColoredPrintf(COLOR_RED,pcVar1);
        std::__cxx11::string::~string(local_98);
        fflush(_stdout);
        exit(1);
      }
      if ((local_24 < 0) || (local_20 <= local_24)) {
        Message::Message(in_stack_fffffffffffffe80);
        Message::operator<<(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        this = Message::operator<<(in_stack_fffffffffffffe50,
                                   (char (*) [18])in_stack_fffffffffffffe48);
        msg_00 = Message::operator<<(in_stack_fffffffffffffe50,
                                     (char (*) [4])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [19])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [16])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [18])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [2])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [3])in_stack_fffffffffffffe48);
        Message::operator<<(in_stack_fffffffffffffe50,(char (*) [19])in_stack_fffffffffffffe48);
        this_00 = Message::operator<<(in_stack_fffffffffffffe50,
                                      (char (*) [2])in_stack_fffffffffffffe48);
        this_01 = Message::operator<<(in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe48);
        Message::operator<<(this_01,(char (*) [3])in_stack_fffffffffffffe48);
        Message::Message(this,msg_00);
        Message::~Message((Message *)0x1819b1);
        Message::GetString_abi_cxx11_(this_00);
        pcVar1 = (char *)std::__cxx11::string::c_str();
        ColoredPrintf(COLOR_RED,pcVar1);
        std::__cxx11::string::~string(local_c8);
        fflush(_stdout);
        exit(1);
      }
      local_1 = 1 < local_20;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ShouldShard(const char* total_shards_env,
                 const char* shard_index_env,
                 bool in_subprocess_for_death_test) {
  if (in_subprocess_for_death_test) {
    return false;
  }

  const Int32 total_shards = Int32FromEnvOrDie(total_shards_env, -1);
  const Int32 shard_index = Int32FromEnvOrDie(shard_index_env, -1);

  if (total_shards == -1 && shard_index == -1) {
    return false;
  } else if (total_shards == -1 && shard_index != -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestShardIndex << " = " << shard_index
      << ", but have left " << kTestTotalShards << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (total_shards != -1 && shard_index == -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestTotalShards << " = " << total_shards
      << ", but have left " << kTestShardIndex << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (shard_index < 0 || shard_index >= total_shards) {
    const Message msg = Message()
      << "Invalid environment variables: we require 0 <= "
      << kTestShardIndex << " < " << kTestTotalShards
      << ", but you have " << kTestShardIndex << "=" << shard_index
      << ", " << kTestTotalShards << "=" << total_shards << ".\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  }

  return total_shards > 1;
}